

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *stream,QCborValue *value)

{
  QCborContainerPrivate *this;
  QCborContainerPrivate *pQVar1;
  Type TVar2;
  long in_FS_OFFSET;
  QByteArray local_58;
  QCborValue local_40;
  QCborParserError local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  operator>>(stream,&local_58);
  local_28.offset = 0;
  local_28.error.c = NoError;
  local_28._12_4_ = 0xaaaaaaaa;
  QCborValue::fromCbor(&local_40,&local_58,&local_28);
  TVar2 = local_40.t;
  pQVar1 = local_40.container;
  local_40.container = (QCborContainerPrivate *)0x0;
  local_40.t = Undefined;
  this = value->container;
  value->n = local_40.n;
  value->container = pQVar1;
  value->t = TVar2;
  if (this != (QCborContainerPrivate *)0x0) {
    QCborContainerPrivate::deref(this);
  }
  if (local_28.error.c != NoError) {
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborValue &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError);
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}